

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationDriveline::Update
          (ChLinkMotorRotationDriveline *this,double mytime,bool update_assets)

{
  ChBodyFrame *pCVar1;
  ChBodyFrame *pCVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  double dVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ChVector<double> abs_shaftdir;
  undefined8 local_68;
  double local_60;
  undefined8 local_58;
  ChCoordsys<double> local_50;
  
  ChLinkMotorRotation::Update(&this->super_ChLinkMotorRotation,mytime,update_assets);
  (**(code **)(*(long *)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric
                         .super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8
              ))(&local_50,this);
  ChCoordsys<double>::TransformDirectionLocalToParent(&local_50,(ChVector<double> *)&VECT_Z);
  pCVar1 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body2;
  pCVar2 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body1;
  auVar25._8_8_ = local_68;
  auVar25._0_8_ = local_68;
  auVar26._8_8_ = local_58;
  auVar26._0_8_ = local_58;
  peVar3 = (this->innerconstraint1).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (this->innerconstraint2).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar11 = vmovhpd_avx(auVar21,*(double *)
                                 ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x18));
  auVar10 = vmovhpd_avx(auVar10,(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0]);
  auVar14 = vmovhpd_avx(auVar14,*(double *)
                                 ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 8));
  auVar5 = vmovhpd_avx(auVar19,*(double *)
                                ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.
                                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data + 0x10));
  auVar22._0_8_ = auVar11._0_8_ * local_60;
  auVar22._8_8_ = auVar11._8_8_ * local_60;
  auVar10 = vfmadd213pd_fma(auVar10,auVar25,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar11 = vmovhpd_avx(auVar23,*(double *)
                                 ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x30));
  auVar19 = vfmadd213pd_fma(auVar11,auVar26,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar11 = vmovhpd_avx(auVar11,*(double *)
                                 ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x20));
  auVar10 = vshufpd_avx(auVar19,auVar19,1);
  auVar12._0_8_ = local_60 * auVar11._0_8_;
  auVar12._8_8_ = local_60 * auVar11._8_8_;
  auVar14 = vfmadd213pd_fma(auVar14,auVar25,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar11 = vmovhpd_avx(auVar13,*(double *)
                                 ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x38));
  auVar12 = vfmadd213pd_fma(auVar11,auVar26,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar11 = vmovhpd_avx(auVar15,*(double *)
                                 ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x28));
  auVar14 = vshufpd_avx(auVar12,auVar12,1);
  auVar16._0_8_ = local_60 * auVar11._0_8_;
  auVar16._8_8_ = local_60 * auVar11._8_8_;
  auVar5 = vfmadd213pd_fma(auVar5,auVar25,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(double *)
        ((long)&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar11 = vmovhpd_avx(auVar17,*(double *)
                                 ((long)&(pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>
                                         .Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data + 0x40));
  auVar13 = vfmadd213pd_fma(auVar11,auVar26,auVar5);
  dVar6 = auVar12._0_8_;
  auVar20._0_8_ = dVar6 * dVar6;
  auVar20._8_8_ = auVar12._8_8_ * auVar12._8_8_;
  auVar5 = vfmadd231pd_fma(auVar20,auVar19,auVar19);
  auVar11 = vshufpd_avx(auVar13,auVar13,1);
  auVar5 = vfmadd231pd_fma(auVar5,auVar13,auVar13);
  auVar12 = vsqrtpd_avx(auVar5);
  auVar5._8_8_ = 0x10000000000000;
  auVar5._0_8_ = 0x10000000000000;
  uVar7 = vcmppd_avx512vl(auVar12,auVar5,5);
  auVar5 = vshufpd_avx(auVar12,auVar12,1);
  dVar18 = 1.0 / auVar12._0_8_;
  dVar24 = 1.0 / auVar5._0_8_;
  uVar9 = (uVar7 & 3) >> 1;
  bVar8 = (byte)(uVar7 & 3);
  (peVar3->shaft_dir).m_data[0] =
       (double)(uVar9 * (long)(auVar10._0_8_ * dVar24) + (ulong)!SUB81(uVar9,0) * 0x3ff0000000000000
               );
  (peVar3->shaft_dir).m_data[1] = (double)(uVar9 * (long)(auVar14._0_8_ * dVar24));
  (peVar3->shaft_dir).m_data[2] = (double)(uVar9 * (long)(auVar11._0_8_ * dVar24));
  (peVar4->shaft_dir).m_data[0] =
       (double)((ulong)(bVar8 & 1) * (long)(auVar19._0_8_ * dVar18) +
               (ulong)!(bool)(bVar8 & 1) * 0x3ff0000000000000);
  (peVar4->shaft_dir).m_data[1] = (double)((ulong)(bVar8 & 1) * (long)(dVar6 * dVar18));
  (peVar4->shaft_dir).m_data[2] = (double)((ulong)(bVar8 & 1) * (long)(auVar13._0_8_ * dVar18));
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorRotation::Update(mytime, update_assets);

    // Update the direction of 1D-3D ChShaftBody constraints:
    ChVector<> abs_shaftdir = this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(VECT_Z);
    ChVector<> shaftdir_b1 = this->Body1->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftdir_b2 = this->Body2->TransformDirectionParentToLocal(abs_shaftdir);

    innerconstraint1->SetShaftDirection(shaftdir_b1);
    innerconstraint2->SetShaftDirection(shaftdir_b2);
}